

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O2

void __thiscall QPDF::removePage(QPDF *this,QPDFObjectHandle *page)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  int at;
  int iVar2;
  unsigned_long __n;
  reference obj;
  QPDFObjectHandle kids;
  QPDFObjectHandle pages;
  allocator<char> local_79;
  key_type in_stack_ffffffffffffff88;
  undefined1 local_58 [16];
  QPDFObjectHandle local_48;
  QPDFObjectHandle local_38;
  
  at = findPage(this,page);
  if (at != 0) {
    _Var1._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    in_stack_ffffffffffffff88 =
         (key_type)
         (((long)*(pointer *)((long)&(_Var1._M_head_impl)->all_pages + 8) -
           *(long *)&((_Var1._M_head_impl)->all_pages).
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> >> 4) -
         1);
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert
              ((unsigned_long *)&stack0xffffffffffffff88);
  }
  getRoot((QPDF *)local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff88,"/Pages",(allocator<char> *)&local_48);
  QPDFObjectHandle::getKey(&local_38,(string *)local_58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff88,"/Kids",(allocator<char> *)&local_48);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_58,(string *)&local_38);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  QPDFObjectHandle::eraseItem((QPDFObjectHandle *)local_58,at);
  iVar2 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff88,"/Count",&local_79);
  QPDFObjectHandle::newInteger((longlong)in_stack_ffffffffffffff88);
  QPDFObjectHandle::replaceKey(&local_38,(string *)&stack0xffffffffffffff88,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::erase
            (&(_Var1._M_head_impl)->all_pages,
             (QPDFObjectHandle *)
             ((long)at * 0x10 +
             *(long *)&((_Var1._M_head_impl)->all_pages).
                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>));
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  QPDFObjectHandle::getObjGen(page);
  std::
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
  ::erase(&((_Var1._M_head_impl)->pageobj_to_pages_pos)._M_t,(key_type *)&stack0xffffffffffffff88);
  for (; at < iVar2; at = at + 1) {
    _Var1._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    __n = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert
                    ((int *)&stack0xffffffffffffff88);
    obj = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                    (&(_Var1._M_head_impl)->all_pages,__n);
    insertPageobjToPage(this,obj,at,false);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDF::removePage(QPDFObjectHandle page)
{
    int pos = findPage(page); // also ensures flat /Pages
    QTC::TC(
        "qpdf",
        "QPDF remove page",
        (pos == 0) ? 0 :                                // remove at beginning
            (pos == toI(m->all_pages.size() - 1)) ? 1   // end
                                                  : 2); // remove in middle

    QPDFObjectHandle pages = getRoot().getKey("/Pages");
    QPDFObjectHandle kids = pages.getKey("/Kids");

    kids.eraseItem(pos);
    int npages = kids.getArrayNItems();
    pages.replaceKey("/Count", QPDFObjectHandle::newInteger(npages));
    m->all_pages.erase(m->all_pages.begin() + pos);
    m->pageobj_to_pages_pos.erase(page.getObjGen());
    for (int i = pos; i < npages; ++i) {
        insertPageobjToPage(m->all_pages.at(toS(i)), i, false);
    }
}